

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_skl_motion::~xr_skl_motion(xr_skl_motion *this)

{
  xr_skl_motion *this_local;
  
  (this->super_xr_motion)._vptr_xr_motion = (_func_int **)&PTR__xr_skl_motion_0038e248;
  delete_elements<std::vector<xray_re::xr_bone_motion*,std::allocator<xray_re::xr_bone_motion*>>>
            (&this->m_bone_motions);
  delete_elements<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>>
            (&this->m_marks);
  std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::~vector
            (&this->m_marks);
  std::vector<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::~vector
            (&this->m_bone_motions);
  xr_motion::~xr_motion(&this->super_xr_motion);
  return;
}

Assistant:

xr_skl_motion::~xr_skl_motion()
{
	delete_elements(m_bone_motions);
	delete_elements(m_marks);
}